

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O3

void __thiscall
Protocol::MQTT::V5::Property<unsigned_short>::~Property(Property<unsigned_short> *this)

{
  operator_delete(this,0x38);
  return;
}

Assistant:

struct Property Final : public PropertyBaseImpl
            {
                /** The property value, depends on the type */
                GenericType<T>           value;

#if MQTTDumpCommunication == 1
                void dump(MQTTString & out, const int indent = 0)
                {
                    out += MQTTStringPrintf("%*sType %s\n", indent, "", PrivateRegistry::getPropertyName(type));
                    out += MQTTStringPrintf("%*s", indent+2, ""); out += (T)value; out += "\n";
                }
#endif

                /** Clone this property */
                PropertyBase * clone() const { return new Property((PropertyType)type, value.value, true); }
                /** Accept a visitor for this type */
                bool acceptVisitor(VisitorVariant & visitor) const
                {
                    if (!PropertyBase::acceptVisitor(visitor)) return false;
                    LittleEndianPODVisitor<T> * view = visitor.as< LittleEndianPODVisitor<T> >();
                    if (!view) return false;
                    return view->acceptBuffer((const uint8*)const_cast< GenericType<T>& >(value).raw(), value.typeSize()) == value.typeSize();
                }

                /** The default constructor */
                Property(const PropertyType type, T v = 0, const bool heap = false) : PropertyBaseImpl(type, value, heap), value(v) {}
            }